

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::scalarTag(Input *this,string *Tag)

{
  string local_38;
  string *local_18;
  string *Tag_local;
  Input *this_local;
  
  local_18 = Tag;
  Tag_local = (string *)this;
  Node::getVerbatimTag_abi_cxx11_(&local_38,this->CurrentNode->_node);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Input::scalarTag(std::string &Tag) {
  Tag = CurrentNode->_node->getVerbatimTag();
}